

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O1

Value * Kvm::openOutputPortProc(Kvm *vm,Value *args)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  ofstream *this;
  Value *pVVar3;
  
  p_Var1 = args[1]._vptr_Value[3];
  this = (ofstream *)operator_new(0x200);
  std::ofstream::ofstream(this,(char *)p_Var1,_S_out);
  pVVar3 = Kgc::allocValue(&vm->gc_,OUTPUT_PORT);
  pp_Var2 = pVVar3[1]._vptr_Value;
  pVVar3[1]._vptr_Value = (_func_int **)this;
  if (pp_Var2 != (_func_int **)0x0) {
    (**(code **)(*pp_Var2 + 8))();
  }
  return pVVar3;
}

Assistant:

const Value* Kvm::openOutputPortProc(Kvm *vm, const Value *args)
{
    const String *s = static_cast<const String *>(car(args));
    auto filename = s->value_;
    std::unique_ptr<std::ofstream> out = std::make_unique<std::ofstream>(filename);
    if (!out)
    {
        std::string msg;
        msg.append("could not open file \"");
        msg.append(filename);
        msg.append("\"");
        throw KatException(msg);
    }
    return vm->makeOutputPort(std::move(out));
}